

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error ft_svg_glyph_prepare(FT_Glyph svg_glyph,FT_GlyphSlot slot)

{
  FT_Pos FVar1;
  FT_Library pFVar2;
  FT_Glyph_Class *pFVar3;
  undefined8 uVar4;
  FT_Pos FVar5;
  undefined8 *puVar6;
  FT_Error error;
  FT_Error local_1c;
  
  local_1c = 0;
  puVar6 = (undefined8 *)ft_mem_alloc(svg_glyph->library->memory,0x80,&local_1c);
  if (local_1c == 0) {
    *puVar6 = svg_glyph[1].library;
    puVar6[1] = svg_glyph[1].clazz;
    FVar1 = svg_glyph[1].advance.y;
    pFVar2 = svg_glyph[2].library;
    pFVar3 = svg_glyph[2].clazz;
    uVar4 = *(undefined8 *)&svg_glyph[2].format;
    FVar5 = svg_glyph[2].advance.x;
    puVar6[2] = svg_glyph[1].advance.x;
    puVar6[3] = FVar1;
    puVar6[4] = pFVar2;
    puVar6[5] = pFVar3;
    puVar6[6] = uVar4;
    puVar6[7] = FVar5;
    puVar6[8] = svg_glyph[2].advance.y;
    *(undefined4 *)(puVar6 + 9) = *(undefined4 *)&svg_glyph[3].library;
    *(undefined2 *)((long)puVar6 + 0x4c) = *(undefined2 *)((long)&svg_glyph[3].library + 4);
    uVar4 = *(undefined8 *)&svg_glyph[3].format;
    FVar1 = svg_glyph[3].advance.x;
    FVar5 = svg_glyph[3].advance.y;
    puVar6[10] = svg_glyph[3].clazz;
    puVar6[0xb] = uVar4;
    puVar6[0xc] = FVar1;
    puVar6[0xd] = FVar5;
    pFVar3 = svg_glyph[4].clazz;
    puVar6[0xe] = svg_glyph[4].library;
    puVar6[0xf] = pFVar3;
    slot->format = FT_GLYPH_FORMAT_SVG;
    slot->glyph_index = svg_glyph[1].format;
    slot->other = puVar6;
  }
  return local_1c;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_prepare( FT_Glyph      svg_glyph,
                        FT_GlyphSlot  slot )
  {
    FT_SvgGlyph  glyph = (FT_SvgGlyph)svg_glyph;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = svg_glyph->library->memory;

    FT_SVG_Document  document = NULL;


    if ( FT_NEW( document ) )
      return error;

    document->svg_document        = glyph->svg_document;
    document->svg_document_length = glyph->svg_document_length;

    document->metrics      = glyph->metrics;
    document->units_per_EM = glyph->units_per_EM;

    document->start_glyph_id = glyph->start_glyph_id;
    document->end_glyph_id   = glyph->end_glyph_id;

    document->transform = glyph->transform;
    document->delta     = glyph->delta;

    slot->format      = FT_GLYPH_FORMAT_SVG;
    slot->glyph_index = glyph->glyph_index;
    slot->other       = document;

    return error;
  }